

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::doRemoveCol(SPxSolverBase<double> *this,int i)

{
  SPxStatus SVar1;
  SPxSolverBase<double> *in_RDI;
  int in_stack_0000003c;
  SPxBasisBase<double> *in_stack_00000040;
  SPxBasisBase<double> *this_00;
  SPxStatus stat;
  undefined4 in_stack_ffffffffffffffe0;
  
  forceRecompNonbasicValue(in_RDI);
  SPxLPBase<double>::doRemoveCol(&this->super_SPxLPBase<double>,i);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  SVar1 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (SVar1 < SINGULAR) {
    return;
  }
  this_00 = &in_RDI->super_SPxBasisBase<double>;
  SPxBasisBase<double>::removedCol(in_stack_00000040,in_stack_0000003c);
  SVar1 = SPxBasisBase<double>::status(this_00);
  stat = (SPxStatus)((ulong)this_00 >> 0x20);
  if (SVar1 != PRIMAL) {
    if (SVar1 == OPTIMAL) {
      setBasisStatus((SPxSolverBase<double> *)CONCAT44(3,in_stack_ffffffffffffffe0),stat);
      return;
    }
    if (SVar1 != UNBOUNDED) {
      return;
    }
  }
  setBasisStatus((SPxSolverBase<double> *)CONCAT44(SVar1,in_stack_ffffffffffffffe0),stat);
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveCol(int i)
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::doRemoveCol(i);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedCol(i);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::PRIMAL:
      case SPxBasisBase<R>::UNBOUNDED:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::DUAL);
         break;

      default:
         break;
      }
   }
}